

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_stream.c
# Opt level: O0

int mk_channel_clean(mk_channel *channel)

{
  mk_list *__mptr_1;
  mk_list *__mptr;
  mk_stream_input *in;
  mk_stream *stream;
  mk_list *head_in;
  mk_list *head;
  mk_list *tmp_in;
  mk_list *tmp;
  mk_channel *channel_local;
  
  head_in = (channel->streams).next;
  tmp_in = head_in->next;
  while (head_in != &channel->streams) {
    stream = (mk_stream *)head_in[-1].next;
    head = *(mk_list **)&stream->dynamic;
    while (stream != (mk_stream *)(head_in + -1)) {
      mk_stream_in_release((mk_stream_input *)&stream[-1].channel);
      stream = (mk_stream *)head;
      head = head->next;
    }
    mk_stream_release((mk_stream *)&head_in[-6].next);
    head_in = tmp_in;
    tmp_in = tmp_in->next;
  }
  return 0;
}

Assistant:

int mk_channel_clean(struct mk_channel *channel)
{
    struct mk_list *tmp;
    struct mk_list *tmp_in;
    struct mk_list *head;
    struct mk_list *head_in;
    struct mk_stream *stream;
    struct mk_stream_input *in;

    mk_list_foreach_safe(head, tmp, &channel->streams) {
        stream = mk_list_entry(head, struct mk_stream, _head);
        mk_list_foreach_safe(head_in, tmp_in, &stream->inputs) {
            in = mk_list_entry(head_in, struct mk_stream_input, _head);
            mk_stream_in_release(in);
        }
        mk_stream_release(stream);
    }

    return 0;
}